

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O1

void __thiscall Assimp::LWO::AnimResolver::UpdateAnimRangeSetup(AnimResolver *this)

{
  void *__src;
  void *__dest;
  double *pdVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  _List_node_base *p_Var5;
  iterator __position;
  Key *pKVar6;
  double dVar7;
  double __y;
  double dVar8;
  double dVar9;
  bool bVar10;
  bool bVar11;
  _List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *this_00;
  bool bVar12;
  iterator iVar13;
  Key *pKVar14;
  void *pvVar15;
  _List_node_base *p_Var16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  _List_node_base *p_Var22;
  size_t __n;
  size_type __n_00;
  void *pvVar23;
  _List_node_base *p_Var24;
  long lVar25;
  undefined1 local_78 [8];
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  AnimResolver *local_50;
  ulong local_48;
  _List_node_base *local_40;
  ulong local_38;
  
  p_Var24 = (this->envelopes->
            super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>)._M_impl
            ._M_node.super__List_node_base._M_next;
  local_50 = this;
  if (p_Var24 != (_List_node_base *)this->envelopes) {
    do {
      p_Var16 = *(_List_node_base **)
                 &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                  (p_Var24 + 2))->_M_impl;
      p_Var22 = *(_List_node_base **)
                 &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                  ((long)(p_Var24 + 2) + 8))->_M_impl;
      if ((p_Var16 != p_Var22) && (*(int *)((long)(p_Var24 + 1) + 8) - 2U < 3)) {
        p_Var5 = p_Var16->_M_next;
        fVar3 = *(float *)&p_Var22[-2]._M_next;
        fVar4 = *(float *)&p_Var16->_M_prev;
        __y = (double)p_Var22[-3]._M_prev - (double)p_Var5;
        dVar7 = fmod((double)p_Var5 - this->first,__y);
        dVar7 = __y - dVar7;
        __position._M_current =
             *(Key **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *
                        )(p_Var24 + 2))->_M_impl;
        pKVar6 = *(Key **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                             *)((long)(p_Var24 + 2) + 8))->_M_impl;
        lVar18 = ((long)pKVar6 - (long)__position._M_current >> 3) * -0x3333333333333333 >> 2;
        iVar13._M_current = __position._M_current;
        if (0 < lVar18) {
          iVar13._M_current = __position._M_current + lVar18 * 4;
          lVar18 = lVar18 + 1;
          pKVar14 = __position._M_current + 2;
          do {
            if (pKVar14[-2].time <= dVar7 && dVar7 != pKVar14[-2].time) {
              pKVar14 = pKVar14 + -2;
              goto LAB_0069bc79;
            }
            if (pKVar14[-1].time <= dVar7 && dVar7 != pKVar14[-1].time) {
              pKVar14 = pKVar14 + -1;
              goto LAB_0069bc79;
            }
            if (pKVar14->time <= dVar7 && dVar7 != pKVar14->time) goto LAB_0069bc79;
            if (pKVar14[1].time <= dVar7 && dVar7 != pKVar14[1].time) {
              pKVar14 = pKVar14 + 1;
              goto LAB_0069bc79;
            }
            lVar18 = lVar18 + -1;
            pKVar14 = pKVar14 + 4;
          } while (1 < lVar18);
        }
        lVar18 = ((long)pKVar6 - (long)iVar13._M_current >> 3) * -0x3333333333333333;
        if (lVar18 == 1) {
LAB_0069bc6d:
          pKVar14 = iVar13._M_current;
          if (dVar7 < (iVar13._M_current)->time || dVar7 == (iVar13._M_current)->time) {
            pKVar14 = pKVar6;
          }
        }
        else if (lVar18 == 2) {
LAB_0069bc4c:
          pKVar14 = iVar13._M_current;
          if (dVar7 < (iVar13._M_current)->time || dVar7 == (iVar13._M_current)->time) {
            iVar13._M_current = iVar13._M_current + 1;
            goto LAB_0069bc6d;
          }
        }
        else {
          pKVar14 = pKVar6;
          if ((lVar18 == 3) &&
             (pKVar14 = iVar13._M_current,
             dVar7 < (iVar13._M_current)->time || dVar7 == (iVar13._M_current)->time)) {
            iVar13._M_current = iVar13._M_current + 1;
            goto LAB_0069bc4c;
          }
        }
LAB_0069bc79:
        this_00 = (_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                  (p_Var24 + 2);
        if (pKVar14 == pKVar6) {
          __n_00 = 0;
        }
        else {
          lVar18 = (long)pKVar6 - (long)pKVar14 >> 3;
          __n_00 = lVar18 * -0x3333333333333333;
          local_78 = (undefined1  [8])0x0;
          dStack_70 = 2.12199579096527e-314;
          local_68 = 0.0;
          dStack_60 = 0.0;
          local_58 = (double)((ulong)local_58 & 0xffffffff00000000);
          std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::_M_fill_insert
                    ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)this_00,
                     __position,__n_00,(value_type *)local_78);
          memmove(*(_List_node_base **)
                   &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                    (p_Var24 + 2))->_M_impl,
                  (void *)(lVar18 * -8 +
                          *(size_t *)
                           &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                              *)((long)(p_Var24 + 2) + 8))->_M_impl),(long)pKVar6 - (long)pKVar14);
        }
        __n = (long)p_Var22 - (long)p_Var16;
        uVar19 = ((long)__n >> 3) * -0x3333333333333333;
        uVar21 = (ulong)(((double)p_Var5 - this->first) / __y);
        local_38 = uVar21 & 0xffffffff;
        std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::resize
                  ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)this_00,
                   local_38 * uVar19 +
                   ((long)(*(size_t *)
                            &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                               *)((long)(p_Var24 + 2) + 8))->_M_impl -
                          (long)*(_List_node_base **)
                                 &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                    *)(p_Var24 + 2))->_M_impl) >> 3) * -0x3333333333333333);
        local_48 = uVar21;
        if ((int)uVar21 != 0) {
          __src = (void *)((long)*(_List_node_base **)
                                  &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                     *)(p_Var24 + 2))->_M_impl + __n_00 * 0x28);
          lVar18 = ((long)__n >> 3) * 8;
          lVar25 = (long)p_Var22 +
                   (long)*(_List_node_base **)
                          &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                             *)(p_Var24 + 2))->_M_impl + (__n_00 * 0x28 - (long)p_Var16) + -0x50;
          uVar21 = 0;
          bVar11 = false;
          pvVar23 = __src;
          local_40 = p_Var24;
          do {
            uVar21 = uVar21 + 1;
            __dest = (void *)((long)__src + uVar19 * uVar21 * 0x28);
            if (p_Var22 != p_Var16) {
              memmove(__dest,__src,__n);
              p_Var24 = local_40;
            }
            if ((((*(int *)((long)(p_Var24 + 1) + 8) == 3) &&
                 (bVar12 = (bool)(bVar11 ^ 1), bVar10 = !bVar11, bVar11 = bVar12, bVar10)) &&
                (__dest != (void *)((long)__dest + (__n - 0x28)))) &&
               (pvVar15 = pvVar23, lVar20 = lVar25, __dest < (void *)((long)__dest + (__n - 0x50))))
            {
              do {
                pdVar1 = (double *)((long)pvVar15 + lVar18);
                local_58 = pdVar1[4];
                local_78 = (undefined1  [8])*pdVar1;
                dStack_70 = pdVar1[1];
                local_68 = pdVar1[2];
                dStack_60 = pdVar1[3];
                pdVar2 = (double *)(lVar20 + -0x28 + lVar18);
                *(undefined4 *)(pdVar1 + 4) = *(undefined4 *)(pdVar2 + 9);
                dVar7 = pdVar2[5];
                dVar8 = pdVar2[6];
                dVar9 = pdVar2[8];
                pdVar1[2] = pdVar2[7];
                pdVar1[3] = dVar9;
                *pdVar1 = dVar7;
                pdVar1[1] = dVar8;
                *(float *)(pdVar2 + 9) = local_58._0_4_;
                pdVar2[7] = local_68;
                pdVar2[8] = dStack_60;
                pdVar2[5] = (double)local_78;
                pdVar2[6] = dStack_70;
                pvVar15 = (void *)((long)pvVar15 + 0x28);
                lVar20 = lVar20 + -0x28;
              } while (pdVar1 + 5 < pdVar2);
            }
            lVar25 = lVar25 + lVar18;
            pvVar23 = (void *)((long)pvVar23 + lVar18);
          } while (uVar21 != local_38);
        }
        dVar7 = (double)((int)local_48 + 1) * __y;
        this = local_50;
        if (__y <= dVar7) {
          p_Var16 = (_List_node_base *)
                    (~uVar19 * 0x28 +
                    *(size_t *)
                     &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                      ((long)(p_Var24 + 2) + 8))->_M_impl);
          uVar17 = 1;
          dVar8 = __y;
          do {
            if ((__y != dVar7) || (NAN(__y) || NAN(dVar7))) {
              p_Var22 = (_List_node_base *)((long)p_Var16 + ~uVar19 * 0x28);
            }
            else {
              p_Var22 = *(_List_node_base **)&this_00->_M_impl;
            }
            if (p_Var22 != p_Var16) {
              do {
                p_Var16->_M_next = (_List_node_base *)((double)p_Var16->_M_next - dVar8);
                if (*(int *)((long)(p_Var24 + 1) + 8) == 4) {
                  *(float *)&p_Var16->_M_prev =
                       *(float *)&p_Var16->_M_prev + (float)uVar17 * (fVar3 - fVar4);
                }
                p_Var16 = (_List_node_base *)&p_Var16[-3]._M_prev;
              } while (p_Var16 != p_Var22);
            }
            dVar8 = dVar8 + __y;
            uVar17 = uVar17 + 1;
          } while (dVar8 <= dVar7);
        }
      }
      p_Var24 = (((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                 &p_Var24->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var24 != (_List_node_base *)this->envelopes);
  }
  return;
}

Assistant:

void AnimResolver::UpdateAnimRangeSetup()
{
    // XXX doesn't work yet (hangs if more than one envelope channels needs to be interpolated)

    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {
        if ((*it).keys.empty()) continue;

        const double my_first = (*it).keys.front().time;
        const double my_last  = (*it).keys.back().time;

        const double delta = my_last-my_first;
        const size_t old_size = (*it).keys.size();

        const float value_delta = (*it).keys.back().value - (*it).keys.front().value;

        // NOTE: We won't handle reset, linear and constant here.
        // See DoInterpolation() for their implementation.

        // process pre behaviour
        switch ((*it).pre) {
            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:
                {
                const double start_time = delta - std::fmod(my_first-first,delta);
                std::vector<LWO::Key>::iterator n = std::find_if((*it).keys.begin(),(*it).keys.end(),
                    [start_time](double t) { return start_time > t; }),m;

                size_t ofs = 0;
                if (n != (*it).keys.end()) {
                    // copy from here - don't use iterators, insert() would invalidate them
                    ofs = (*it).keys.end()-n;
                    (*it).keys.insert((*it).keys.begin(),ofs,LWO::Key());

                    std::copy((*it).keys.end()-ofs,(*it).keys.end(),(*it).keys.begin());
                }

                // do full copies. again, no iterators
                const unsigned int num = (unsigned int)((my_first-first) / delta);
                (*it).keys.resize((*it).keys.size() + num*old_size);

                n = (*it).keys.begin()+ofs;
                bool reverse = false;
                for (unsigned int i = 0; i < num; ++i) {
                    m = n+old_size*(i+1);
                    std::copy(n,n+old_size,m);

                    if ((*it).pre == LWO::PrePostBehaviour_Oscillate && (reverse = !reverse))
                        std::reverse(m,m+old_size-1);
                }

                // update time values
                n = (*it).keys.end() - (old_size+1);
                double cur_minus = delta;
                unsigned int tt = 1;
                for (const double tmp =  delta*(num+1);cur_minus <= tmp;cur_minus += delta,++tt) {
                    m = (delta == tmp ? (*it).keys.begin() :  n - (old_size+1));
                    for (;m != n; --n) {
                        (*n).time -= cur_minus;

                        // offset repeat? add delta offset to key value
                        if ((*it).pre == LWO::PrePostBehaviour_OffsetRepeat) {
                            (*n).value += tt * value_delta;
                        }
                    }
                }
                break;
                }
            default:
                // silence compiler warning
                break;
        }

        // process post behaviour
        switch ((*it).post) {

            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:

                break;

            default:
                // silence compiler warning
                break;
        }
    }
}